

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_struct_tostring
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  e_req eVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  char *pcVar7;
  pointer pptVar8;
  string tmp_count;
  string tmpvar;
  string local_f8;
  t_struct *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d8 = tstruct;
  std::__cxx11::string::string((string *)&local_50,"tmp",(allocator *)&local_d0);
  t_generator::tmp(&local_b0,(t_generator *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_d0);
  poVar6 = std::operator<<(poVar6,"public override string ToString()");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"{");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_d0);
  poVar6 = std::operator<<(poVar6,"var ");
  poVar6 = std::operator<<(poVar6,(string *)&local_b0);
  poVar6 = std::operator<<(poVar6," = new StringBuilder(\"");
  iVar5 = (*(local_d8->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar5));
  poVar6 = std::operator<<(poVar6,"(\");");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_70,"tmp",(allocator *)&local_f8);
  t_generator::tmp(&local_d0,(t_generator *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pptVar8 = (local_d8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar3 = true;
  if ((pptVar8 !=
       (local_d8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && ((*pptVar8)->req_ != T_REQUIRED)) {
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_f8);
    poVar6 = std::operator<<(poVar6,"int ");
    poVar6 = std::operator<<(poVar6,local_d0._M_dataplus._M_p);
    poVar6 = std::operator<<(poVar6," = 0;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f8);
    pptVar8 = (local_d8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    bVar3 = false;
  }
  bVar4 = false;
  for (; pptVar8 !=
         (local_d8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    eVar2 = (*pptVar8)->req_;
    generate_null_check_begin(this,out,*pptVar8);
    if (bVar3 || bVar4) {
      t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
      poVar6 = std::operator<<(out,(string *)&local_f8);
      poVar6 = std::operator<<(poVar6,(string *)&local_b0);
      poVar6 = std::operator<<(poVar6,".Append(\", ");
      prop_name_abi_cxx11_(&local_90,this,*pptVar8,false);
      poVar6 = std::operator<<(poVar6,(string *)&local_90);
      poVar6 = std::operator<<(poVar6,": \");");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
      poVar6 = std::operator<<(out,(string *)&local_f8);
      poVar6 = std::operator<<(poVar6,"if(0 < ");
      poVar6 = std::operator<<(poVar6,local_d0._M_dataplus._M_p);
      pcVar7 = "++";
      if (eVar2 == T_REQUIRED) {
        pcVar7 = "";
      }
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6,") { ");
      poVar6 = std::operator<<(poVar6,(string *)&local_b0);
      poVar6 = std::operator<<(poVar6,".Append(\", \"); }");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f8);
      t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
      poVar6 = std::operator<<(out,(string *)&local_f8);
      poVar6 = std::operator<<(poVar6,(string *)&local_b0);
      poVar6 = std::operator<<(poVar6,".Append(\"");
      prop_name_abi_cxx11_(&local_90,this,*pptVar8,false);
      poVar6 = std::operator<<(poVar6,(string *)&local_90);
      poVar6 = std::operator<<(poVar6,": \");");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f8);
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_f8);
    prop_name_abi_cxx11_(&local_90,this,*pptVar8,false);
    poVar6 = std::operator<<(poVar6,(string *)&local_90);
    poVar6 = std::operator<<(poVar6,".ToString(");
    poVar6 = std::operator<<(poVar6,(string *)&local_b0);
    poVar6 = std::operator<<(poVar6,");");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f8);
    generate_null_check_end(this,out,*pptVar8);
    bVar4 = (bool)(bVar4 | eVar2 == T_REQUIRED);
  }
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,(string *)&local_b0);
  poVar6 = std::operator<<(poVar6,".Append(\')\');");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_90);
  poVar6 = std::operator<<(poVar6,"return ");
  poVar6 = std::operator<<(poVar6,(string *)&local_b0);
  poVar6 = std::operator<<(poVar6,".ToString();");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_f8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_tostring(ostream& out, t_struct* tstruct)
{
    string tmpvar = tmp("tmp");
    out << indent() << "public override string ToString()" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "var " << tmpvar << " = new StringBuilder(\"" << tstruct->get_name() << "(\");" << endl;

    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool useFirstFlag = false;
    string tmp_count = tmp("tmp");
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (!field_is_required((*f_iter)))
        {
            out << indent() << "int " << tmp_count.c_str() << " = 0;" << endl;
            useFirstFlag = true;
        }
        break;
    }

    bool had_required = false; // set to true after first required field has been processed

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        bool is_required = field_is_required(*f_iter);
        generate_null_check_begin(out, *f_iter);

        if (useFirstFlag && (!had_required))
        {
            out << indent() << "if(0 < " << tmp_count.c_str() << (is_required ? "" : "++") << ") { " << tmpvar << ".Append(\", \"); }" << endl;
            out << indent() << tmpvar << ".Append(\"" << prop_name(*f_iter) << ": \");" << endl;
        }
        else
        {
            out << indent() << tmpvar << ".Append(\", " << prop_name(*f_iter) << ": \");" << endl;
        }

        out << indent() << prop_name(*f_iter) << ".ToString(" << tmpvar << ");" << endl;

        generate_null_check_end(out, *f_iter);
        if (is_required) {
            had_required = true; // now __count must be > 0, so we don't need to check it anymore
        }
    }

    out << indent() << tmpvar << ".Append(')');" << endl
        << indent() << "return " << tmpvar << ".ToString();" << endl;
    indent_down();
    out << indent() << "}" << endl;
}